

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O2

void __thiscall QMdiSubWindowPrivate::setSizeGripVisible(QMdiSubWindowPrivate *this,bool visible)

{
  QSizeGrip **ppQVar1;
  QList<QSizeGrip_*> *__range1;
  long lVar2;
  long lVar3;
  long in_FS_OFFSET;
  QArrayDataPointer<QSizeGrip_*> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.ptr = (QSizeGrip **)&DAT_aaaaaaaaaaaaaaaa;
  QObject::findChildren<QSizeGrip*>
            ((QList<QSizeGrip_*> *)&local_48,*(QObject **)&(this->super_QWidgetPrivate).field_0x8,
             (FindChildOptions)0x1);
  ppQVar1 = local_48.ptr;
  lVar3 = local_48.size << 3;
  for (lVar2 = 0; lVar3 != lVar2; lVar2 = lVar2 + 8) {
    (**(code **)(**(long **)((long)ppQVar1 + lVar2) + 0x68))
              (*(long **)((long)ppQVar1 + lVar2),visible);
  }
  QArrayDataPointer<QSizeGrip_*>::~QArrayDataPointer(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMdiSubWindowPrivate::setSizeGripVisible(bool visible) const
{
    // See if we can find any size grips
    const QList<QSizeGrip *> sizeGrips = q_func()->findChildren<QSizeGrip *>();
    for (QSizeGrip *grip : sizeGrips)
        grip->setVisible(visible);
}